

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O0

uint Extra_TruthCanonNPN2(uint uTruth,int nVars,Vec_Int_t *vRes)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int local_34;
  int local_30;
  int i;
  int k;
  int nMints;
  uint uPerm;
  uint uPhase;
  uint uTruthC;
  uint uTruthMin;
  Vec_Int_t *vRes_local;
  int nVars_local;
  uint uTruth_local;
  
  if (Extra_TruthCanonNPN2::pPerms == (char **)0x0) {
    Extra_TruthCanonNPN2::nPerms = Extra_Factorial(nVars);
    Extra_TruthCanonNPN2::pPerms = Extra_Permutations(nVars);
    Extra_TruthCanonNPN2::nVarsOld = nVars;
  }
  else if (Extra_TruthCanonNPN2::nVarsOld != nVars) {
    if (Extra_TruthCanonNPN2::pPerms != (char **)0x0) {
      free(Extra_TruthCanonNPN2::pPerms);
      Extra_TruthCanonNPN2::pPerms = (char **)0x0;
    }
    Extra_TruthCanonNPN2::nPerms = Extra_Factorial(nVars);
    Extra_TruthCanonNPN2::pPerms = Extra_Permutations(nVars);
    Extra_TruthCanonNPN2::nVarsOld = nVars;
  }
  iVar1 = 1 << ((byte)nVars & 0x1f);
  uPhase = 0xffffffff;
  for (local_34 = 0; local_34 < iVar1; local_34 = local_34 + 1) {
    uVar2 = Extra_TruthPolarize(uTruth,local_34,nVars);
    for (local_30 = 0; local_30 < Extra_TruthCanonNPN2::nPerms; local_30 = local_30 + 1) {
      uVar3 = Extra_TruthPermute(uVar2,Extra_TruthCanonNPN2::pPerms[local_30],nVars,0);
      if ((uVar3 & 1) == 0) {
        Vec_IntPushUnique(vRes,uVar3);
      }
      if (uVar3 < uPhase) {
        uPhase = uVar3;
      }
    }
    uVar2 = Extra_TruthPolarize((uTruth ^ 0xffffffff) & 0xffffffffU >> (0x20U - (char)iVar1 & 0x1f),
                                local_34,nVars);
    for (local_30 = 0; local_30 < Extra_TruthCanonNPN2::nPerms; local_30 = local_30 + 1) {
      uVar3 = Extra_TruthPermute(uVar2,Extra_TruthCanonNPN2::pPerms[local_30],nVars,0);
      if ((uVar3 & 1) == 0) {
        Vec_IntPushUnique(vRes,uVar3);
      }
      if (uVar3 < uPhase) {
        uPhase = uVar3;
      }
    }
  }
  return uPhase;
}

Assistant:

unsigned Extra_TruthCanonNPN2( unsigned uTruth, int nVars, Vec_Int_t * vRes )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uTruthC, uPhase, uPerm;
    int nMints, k, i;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    nMints    = (1 << nVars);
    uTruthC   = (unsigned)( (~uTruth) & ((~((unsigned)0)) >> (32-nMints)) );
    uTruthMin = 0xFFFFFFFF;
    for ( i = 0; i < nMints; i++ )
    {
        uPhase = Extra_TruthPolarize( uTruth, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( !(uPerm & 1) )
            Vec_IntPushUnique( vRes, uPerm );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
        uPhase = Extra_TruthPolarize( uTruthC, i, nVars ); 
        for ( k = 0; k < nPerms; k++ )
        {
            uPerm = Extra_TruthPermute( uPhase, pPerms[k], nVars, 0 );
            if ( !(uPerm & 1) )
            Vec_IntPushUnique( vRes, uPerm );
            if ( uTruthMin > uPerm )
                uTruthMin = uPerm;
        }
    }
    return uTruthMin;
}